

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O0

int mml_get_length(char **ptr)

{
  int len;
  char **ptr_local;
  
  ptr_local._4_4_ = mml_get_value(ptr);
  switch(ptr_local._4_4_) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 8:
  case 0xc:
  case 0x10:
  case 0x18:
  case 0x20:
  case 0x30:
  case 0x40:
  case 0x60:
    break;
  default:
    ptr_local._4_4_ = 0;
  }
  return ptr_local._4_4_;
}

Assistant:

int
mml_get_length(char **ptr)
{
	int len;

	len = mml_get_value(ptr);

	switch (len) {
	case  1:
	case  2:
	case  3:
	case  4:
	case  6:
	case  8:
	case 12:
	case 16:
	case 24:
	case 32:
	case 48:
	case 64:
	case 96:
		return (len);

	default:
		return (0);
	}
}